

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableDrawBorders(ImGuiTable *table)

{
  ImVec2 *pIVar1;
  char cVar2;
  ImGuiWindow *pIVar3;
  ImDrawList *draw_list;
  ImVec2 IVar4;
  ImVec2 IVar5;
  ImGuiCol idx;
  bool bVar6;
  ImU32 IVar7;
  uint uVar8;
  ulong uVar9;
  ImGuiTableColumn *pIVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  ImVec2 local_58;
  float local_50;
  float local_4c;
  ImRect outer_border;
  
  pIVar3 = table->InnerWindow;
  bVar6 = ImRect::Overlaps(&table->OuterWindow->ClipRect,&table->OuterRect);
  if (!bVar6) {
    return;
  }
  draw_list = pIVar3->DrawList;
  ImDrawListSplitter::SetCurrentChannel(table->DrawSplitter,draw_list,0);
  ImDrawList::PushClipRect
            (draw_list,(table->Bg0ClipRectForDrawCmd).Min,(table->Bg0ClipRectForDrawCmd).Max,false);
  fVar13 = (table->InnerRect).Min.y;
  fVar14 = (table->InnerRect).Max.y;
  fVar12 = fVar13;
  if (table->IsUsingHeaders == true) {
    fVar11 = fVar13;
    if (table->FreezeRowsCount < '\x01') {
      fVar11 = (table->WorkRect).Min.y;
    }
    fVar11 = fVar11 + table->LastFirstRowHeight;
    fVar12 = fVar14;
    if (fVar11 <= fVar14) {
      fVar12 = fVar11;
    }
  }
  uVar8 = table->Flags;
  if ((uVar8 >> 9 & 1) != 0) {
    uVar9 = 0;
    local_50 = fVar14;
    local_4c = fVar13;
    while ((long)uVar9 < (long)table->ColumnsCount) {
      if ((table->EnabledMaskByDisplayOrder >> (uVar9 & 0x3f) & 1) == 0) {
        uVar9 = uVar9 + 1;
      }
      else {
        cVar2 = (table->DisplayOrderToIndex).Data[uVar9];
        if (table->ResizedColumn == cVar2) {
          bVar6 = table->InstanceInteracted == table->InstanceCurrent;
        }
        else {
          bVar6 = false;
        }
        pIVar10 = (table->Columns).Data + cVar2;
        uVar9 = uVar9 + 1;
        fVar11 = pIVar10->MaxX;
        pIVar1 = &(table->InnerClipRect).Max;
        if ((bool)((fVar11 < pIVar1->x || fVar11 == pIVar1->x) | bVar6)) {
          if ((((pIVar10->NextEnabledColumn != -1) || ((pIVar10->Flags & 0x40000020U) == 0)) ||
              ((table->Flags & 0x1e000U) == 0x4000)) && ((pIVar10->ClipRect).Min.x < fVar11)) {
            fVar11 = fVar14;
            if ((table->HoveredColumnBorder == cVar2 || bVar6) ||
               (uVar9 == (uint)(int)table->FreezeColumnsCount)) {
              if (bVar6) {
                idx = 0x1d;
              }
              else {
                if (table->HoveredColumnBorder != cVar2) {
                  IVar7 = table->BorderColorStrong;
                  goto LAB_0014620f;
                }
                idx = 0x1c;
              }
              IVar7 = GetColorU32(idx,1.0);
              fVar11 = local_50;
              fVar13 = local_4c;
              fVar14 = local_50;
            }
            else {
              bVar6 = (table->Flags & 0x1800) == 0;
              if (!bVar6) {
                fVar11 = fVar12;
              }
              IVar7 = table->RowBgColor[(ulong)bVar6 + 2];
            }
LAB_0014620f:
            if (fVar13 < fVar11) {
              outer_border.Min.x = pIVar10->MaxX;
              local_58.y = fVar11;
              local_58.x = outer_border.Min.x;
              outer_border.Min.y = fVar13;
              ImDrawList::AddLine(draw_list,&outer_border.Min,&local_58,IVar7,1.0);
              fVar13 = local_4c;
              fVar14 = local_50;
            }
          }
        }
      }
    }
    uVar8 = table->Flags;
  }
  if ((uVar8 & 0x500) == 0) goto LAB_00146375;
  IVar4 = (table->OuterRect).Min;
  IVar5 = (table->OuterRect).Max;
  outer_border.Min.x = IVar4.x;
  outer_border.Min.y = IVar4.y;
  outer_border.Max.x = IVar5.x;
  outer_border.Max.y = IVar5.y;
  IVar7 = table->BorderColorStrong;
  if ((uVar8 & 0x500) == 0x500) {
    ImDrawList::AddRect(draw_list,&outer_border.Min,&outer_border.Max,IVar7,0.0,0,1.0);
  }
  else {
    if ((uVar8 >> 10 & 1) == 0) {
      if ((uVar8 >> 8 & 1) == 0) goto LAB_00146372;
      local_58.y = outer_border.Min.y;
      local_58.x = outer_border.Max.x;
      ImDrawList::AddLine(draw_list,&outer_border.Min,&local_58,IVar7,1.0);
      local_58.y = outer_border.Max.y;
      local_58.x = outer_border.Min.x;
    }
    else {
      local_58.y = outer_border.Max.y;
      local_58.x = outer_border.Min.x;
      ImDrawList::AddLine(draw_list,&outer_border.Min,&local_58,IVar7,1.0);
      local_58.y = outer_border.Min.y;
      local_58.x = outer_border.Max.x;
    }
    ImDrawList::AddLine(draw_list,&local_58,&outer_border.Max,IVar7,1.0);
  }
LAB_00146372:
  uVar8 = table->Flags;
LAB_00146375:
  if ((((char)uVar8 < '\0') && (fVar13 = table->RowPosY2, fVar13 < (table->OuterRect).Max.y)) &&
     (((table->BgClipRect).Min.y <= fVar13 && (fVar13 < (table->BgClipRect).Max.y)))) {
    outer_border.Min.x = table->BorderX1;
    local_58.y = fVar13;
    local_58.x = table->BorderX2;
    outer_border.Min.y = fVar13;
    ImDrawList::AddLine(draw_list,&outer_border.Min,&local_58,table->BorderColorLight,1.0);
  }
  ImDrawList::PopClipRect(draw_list);
  return;
}

Assistant:

void ImGui::TableDrawBorders(ImGuiTable* table)
{
    ImGuiWindow* inner_window = table->InnerWindow;
    if (!table->OuterWindow->ClipRect.Overlaps(table->OuterRect))
        return;

    ImDrawList* inner_drawlist = inner_window->DrawList;
    table->DrawSplitter->SetCurrentChannel(inner_drawlist, TABLE_DRAW_CHANNEL_BG0);
    inner_drawlist->PushClipRect(table->Bg0ClipRectForDrawCmd.Min, table->Bg0ClipRectForDrawCmd.Max, false);

    // Draw inner border and resizing feedback
    const float border_size = TABLE_BORDER_SIZE;
    const float draw_y1 = table->InnerRect.Min.y;
    const float draw_y2_body = table->InnerRect.Max.y;
    const float draw_y2_head = table->IsUsingHeaders ? ImMin(table->InnerRect.Max.y, (table->FreezeRowsCount >= 1 ? table->InnerRect.Min.y : table->WorkRect.Min.y) + table->LastFirstRowHeight) : draw_y1;
    if (table->Flags & ImGuiTableFlags_BordersInnerV)
    {
        for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
        {
            if (!(table->EnabledMaskByDisplayOrder & ((ImU64)1 << order_n)))
                continue;

            const int column_n = table->DisplayOrderToIndex[order_n];
            ImGuiTableColumn* column = &table->Columns[column_n];
            const bool is_hovered = (table->HoveredColumnBorder == column_n);
            const bool is_resized = (table->ResizedColumn == column_n) && (table->InstanceInteracted == table->InstanceCurrent);
            const bool is_resizable = (column->Flags & (ImGuiTableColumnFlags_NoResize | ImGuiTableColumnFlags_NoDirectResize_)) == 0;
            const bool is_frozen_separator = (table->FreezeColumnsCount == order_n + 1);
            if (column->MaxX > table->InnerClipRect.Max.x && !is_resized)
                continue;

            // Decide whether right-most column is visible
            if (column->NextEnabledColumn == -1 && !is_resizable)
                if ((table->Flags & ImGuiTableFlags_SizingMask_) != ImGuiTableFlags_SizingFixedSame || (table->Flags & ImGuiTableFlags_NoHostExtendX))
                    continue;
            if (column->MaxX <= column->ClipRect.Min.x) // FIXME-TABLE FIXME-STYLE: Assume BorderSize==1, this is problematic if we want to increase the border size..
                continue;

            // Draw in outer window so right-most column won't be clipped
            // Always draw full height border when being resized/hovered, or on the delimitation of frozen column scrolling.
            ImU32 col;
            float draw_y2;
            if (is_hovered || is_resized || is_frozen_separator)
            {
                draw_y2 = draw_y2_body;
                col = is_resized ? GetColorU32(ImGuiCol_SeparatorActive) : is_hovered ? GetColorU32(ImGuiCol_SeparatorHovered) : table->BorderColorStrong;
            }
            else
            {
                draw_y2 = (table->Flags & (ImGuiTableFlags_NoBordersInBody | ImGuiTableFlags_NoBordersInBodyUntilResize)) ? draw_y2_head : draw_y2_body;
                col = (table->Flags & (ImGuiTableFlags_NoBordersInBody | ImGuiTableFlags_NoBordersInBodyUntilResize)) ? table->BorderColorStrong : table->BorderColorLight;
            }

            if (draw_y2 > draw_y1)
                inner_drawlist->AddLine(ImVec2(column->MaxX, draw_y1), ImVec2(column->MaxX, draw_y2), col, border_size);
        }
    }

    // Draw outer border
    // FIXME: could use AddRect or explicit VLine/HLine helper?
    if (table->Flags & ImGuiTableFlags_BordersOuter)
    {
        // Display outer border offset by 1 which is a simple way to display it without adding an extra draw call
        // (Without the offset, in outer_window it would be rendered behind cells, because child windows are above their
        // parent. In inner_window, it won't reach out over scrollbars. Another weird solution would be to display part
        // of it in inner window, and the part that's over scrollbars in the outer window..)
        // Either solution currently won't allow us to use a larger border size: the border would clipped.
        const ImRect outer_border = table->OuterRect;
        const ImU32 outer_col = table->BorderColorStrong;
        if ((table->Flags & ImGuiTableFlags_BordersOuter) == ImGuiTableFlags_BordersOuter)
        {
            inner_drawlist->AddRect(outer_border.Min, outer_border.Max, outer_col, 0.0f, 0, border_size);
        }
        else if (table->Flags & ImGuiTableFlags_BordersOuterV)
        {
            inner_drawlist->AddLine(outer_border.Min, ImVec2(outer_border.Min.x, outer_border.Max.y), outer_col, border_size);
            inner_drawlist->AddLine(ImVec2(outer_border.Max.x, outer_border.Min.y), outer_border.Max, outer_col, border_size);
        }
        else if (table->Flags & ImGuiTableFlags_BordersOuterH)
        {
            inner_drawlist->AddLine(outer_border.Min, ImVec2(outer_border.Max.x, outer_border.Min.y), outer_col, border_size);
            inner_drawlist->AddLine(ImVec2(outer_border.Min.x, outer_border.Max.y), outer_border.Max, outer_col, border_size);
        }
    }
    if ((table->Flags & ImGuiTableFlags_BordersInnerH) && table->RowPosY2 < table->OuterRect.Max.y)
    {
        // Draw bottom-most row border
        const float border_y = table->RowPosY2;
        if (border_y >= table->BgClipRect.Min.y && border_y < table->BgClipRect.Max.y)
            inner_drawlist->AddLine(ImVec2(table->BorderX1, border_y), ImVec2(table->BorderX2, border_y), table->BorderColorLight, border_size);
    }

    inner_drawlist->PopClipRect();
}